

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  ushort uVar1;
  int iVar2;
  pollfd *__fds;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  int fd;
  size_t sz;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  
  __fds = (pollfd *)nn_alloc_((long)nfds << 4);
  if (__fds == (pollfd *)0x0) {
LAB_0014f109:
    nn_poll_cold_3();
  }
  if (nfds == 0) {
    iVar2 = 0;
    iVar5 = poll(__fds,0,timeout);
    if (iVar5 < 1) goto LAB_0014f0b8;
  }
  else {
    uVar4 = 0;
    iVar5 = 0;
    local_38 = nfds;
    local_34 = timeout;
    do {
      uVar1 = fds[uVar4].events;
      if ((uVar1 & 1) != 0) {
        local_40 = 4;
        iVar2 = nn_getsockopt(fds[uVar4].fd,0,0xb,&local_44,&local_40);
        if (iVar2 < 0) goto LAB_0014f0ef;
        if (local_40 == 4) {
          __fds[iVar5].fd = local_44;
          __fds[iVar5].events = 1;
          iVar5 = iVar5 + 1;
          uVar1 = fds[uVar4].events;
          goto LAB_0014efbd;
        }
        nn_poll_cold_1();
LAB_0014f104:
        nn_poll_cold_2();
        goto LAB_0014f109;
      }
LAB_0014efbd:
      if ((uVar1 & 2) != 0) {
        local_40 = 4;
        iVar2 = nn_getsockopt(fds[uVar4].fd,0,10,&local_44,&local_40);
        if (iVar2 < 0) {
LAB_0014f0ef:
          nn_free(__fds);
          return -1;
        }
        if (local_40 != 4) goto LAB_0014f104;
        __fds[iVar5].fd = local_44;
        __fds[iVar5].events = 1;
        iVar5 = iVar5 + 1;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)nfds != uVar4);
    iVar5 = poll(__fds,(long)iVar5,local_34);
    if (iVar5 < 1) {
LAB_0014f0b8:
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      nn_free(__fds);
      *piVar3 = iVar2;
      return iVar5;
    }
    if (local_38 == 0) {
      iVar2 = 0;
    }
    else {
      uVar4 = 0;
      iVar2 = 0;
      iVar5 = 0;
      do {
        fds[uVar4].revents = 0;
        if ((fds[uVar4].events & 1U) == 0) {
          uVar1 = 0;
        }
        else {
          bVar6 = (__fds[iVar5].revents & 1) != 0;
          if (bVar6) {
            fds[uVar4].revents = 1;
          }
          uVar1 = (ushort)bVar6;
          iVar5 = iVar5 + 1;
        }
        if ((fds[uVar4].events & 2U) != 0) {
          if ((__fds[iVar5].revents & 1) != 0) {
            uVar1 = uVar1 | 2;
            fds[uVar4].revents = uVar1;
          }
          iVar5 = iVar5 + 1;
        }
        iVar2 = (iVar2 + 1) - (uint)(uVar1 == 0);
        uVar4 = uVar4 + 1;
      } while ((uint)nfds != uVar4);
    }
  }
  nn_free(__fds);
  return iVar2;
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}